

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O3

mcu8str * mctools_basename(mcu8str *__return_storage_ptr__,mcu8str *path)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  char cVar5;
  int iVar6;
  long lVar7;
  char *__src;
  mcu8str_size_t mVar8;
  mcu8str_size_t mVar9;
  
  pcVar3 = path->c_str;
  uVar2 = path->size;
  iVar6 = mctools_impl_has_winnamespace(path);
  cVar5 = mctools_drive_letter(path);
  if (pcVar3 + (ulong)(cVar5 != '\0') * 2 + (ulong)(iVar6 != 0) * 4 != pcVar3 + uVar2) {
    mVar8 = 1;
    __src = pcVar3 + uVar2;
    while( true ) {
      pcVar4 = __src;
      mVar9 = mVar8;
      __src = pcVar4 + -1;
      cVar1 = *__src;
      if (__src <= pcVar3 + (ulong)(cVar5 != '\0') * 2 + (ulong)(iVar6 != 0) * 4) break;
      if ((cVar1 == '/') || (mVar8 = mVar9 + 1, cVar1 == '\\')) goto LAB_001091ad;
    }
    if ((cVar1 != '/') && (cVar1 != '\\')) goto LAB_001091b9;
LAB_001091ad:
    if (mVar9 != 1) {
      mVar9 = mVar9 - 1;
      __src = pcVar4;
LAB_001091b9:
      mVar8 = mVar9;
      if ((mVar9 != 1) || (mVar8 = 1, *__src != '.')) {
        mcu8str_create(__return_storage_ptr__,mVar8);
        memcpy(__return_storage_ptr__->c_str,__src,mVar9 + 1);
        lVar7 = 8;
        goto LAB_00109205;
      }
    }
  }
  __return_storage_ptr__->c_str = mcu8str_create_empty::dummy;
  __return_storage_ptr__->size = 0;
  __return_storage_ptr__->buflen = 0;
  mVar9 = 0;
  lVar7 = 0x10;
LAB_00109205:
  *(int *)((long)&__return_storage_ptr__->c_str + lVar7) = (int)mVar9;
  return __return_storage_ptr__;
}

Assistant:

mcu8str mctools_basename( const mcu8str* path )
  {
    const char * itB = path->c_str;
    const char * itE = path->c_str + path->size;

    if ( mctools_impl_has_winnamespace( path ) )
      itB += 4;//skip '\\?\'
    if ( mctools_drive_letter( path ) )
      itB += 2;//skip drive letter

    if ( itB == itE )
      return mcu8str_create_empty();

    //Find last path sep:
    const char * it = itE - 1;
    while ( it > itB && *it!='/' && *it!='\\' )
      --it;
    if ( *it=='/' || *it=='\\' )
      ++it;
    mcu8str_size_t bnsize = (mcu8str_size_t)(itE - it);
    if ( bnsize == 0 || ( bnsize==1 && *it=='.' ) )
      return mcu8str_create_empty();
    mcu8str res = mcu8str_create( bnsize );
    STDNS memcpy( res.c_str, it, bnsize + 1 );
    res.size = (unsigned)bnsize;//cast ok due to mcu8str_create
    return res;
  }